

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlUnsetProp(void)

{
  int iVar1;
  int iVar2;
  xmlNodePtr val;
  xmlChar *val_00;
  int local_34;
  int n_name;
  xmlChar *name;
  int n_node;
  xmlNodePtr node;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (name._4_4_ = 0; (int)name._4_4_ < 3; name._4_4_ = name._4_4_ + 1) {
    for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlNodePtr(name._4_4_,0);
      val_00 = gen_const_xmlChar_ptr(local_34,1);
      iVar2 = xmlUnsetProp(val,val_00);
      desret_int(iVar2);
      call_tests = call_tests + 1;
      des_xmlNodePtr(name._4_4_,val,0);
      des_const_xmlChar_ptr(local_34,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlUnsetProp",(ulong)(uint)(iVar2 - iVar1));
        ret_val = ret_val + 1;
        printf(" %d",(ulong)name._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlUnsetProp(void) {
    int test_ret = 0;

#if defined(LIBXML_TREE_ENABLED) || defined(LIBXML_SCHEMAS_ENABLED)
    int mem_base;
    int ret_val;
    xmlNodePtr node; /* the node */
    int n_node;
    xmlChar * name; /* the attribute name */
    int n_name;

    for (n_node = 0;n_node < gen_nb_xmlNodePtr;n_node++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
        mem_base = xmlMemBlocks();
        node = gen_xmlNodePtr(n_node, 0);
        name = gen_const_xmlChar_ptr(n_name, 1);

        ret_val = xmlUnsetProp(node, (const xmlChar *)name);
        desret_int(ret_val);
        call_tests++;
        des_xmlNodePtr(n_node, node, 0);
        des_const_xmlChar_ptr(n_name, (const xmlChar *)name, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlUnsetProp",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_node);
            printf(" %d", n_name);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}